

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::BeginGlobal
          (BinaryReaderObjdump *this,Index index,Type type,bool mutable_)

{
  ObjdumpState *pOVar1;
  pointer pbVar2;
  char *pcVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  Type local_1c;
  
  local_1c.enum_ = type.enum_;
  pcVar3 = Type::GetName(&local_1c);
  PrintDetails(this," - global[%u] %s mutable=%d",(ulong)index,pcVar3,
               CONCAT71(in_register_00000009,mutable_) & 0xffffffff);
  pOVar1 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
  pbVar2 = (pOVar1->global_names).names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (ulong)index;
  if (uVar4 < (ulong)((long)(pOVar1->global_names).names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) {
    if (pbVar2[uVar4]._M_string_length != 0) {
      PrintDetails(this," <%.*s>",pbVar2[uVar4]._M_string_length,pbVar2[uVar4]._M_dataplus._M_p);
    }
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::BeginGlobal(Index index, Type type, bool mutable_) {
  PrintDetails(" - global[%" PRIindex "] %s mutable=%d", index, type.GetName(),
               mutable_);
  string_view name = GetGlobalName(index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  return Result::Ok;
}